

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O1

int32_t ucnv_extMatchToU(int32_t *cx,int8_t sisoState,char *pre,int32_t preLength,char *src,
                        int32_t srcLength,uint32_t *pMatchValue,UBool param_8,UBool flush)

{
  byte bVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int32_t iVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint *puVar10;
  char *pcVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar15;
  int iVar16;
  uint uVar17;
  char local_49;
  uint local_48;
  ulong uVar14;
  
  iVar9 = 0;
  if ((cx != (int32_t *)0x0) && (0 < cx[2])) {
    if (sisoState == '\0') {
      if (1 < preLength) {
        return 0;
      }
      iVar5 = 1;
      if (srcLength < 1) {
        iVar5 = srcLength;
      }
      srcLength = 0;
      if (preLength != 1) {
        srcLength = iVar5;
      }
      local_49 = '\x01';
    }
    else {
      local_49 = param_8;
    }
    local_48 = 0;
    iVar16 = 0;
    iVar8 = 0;
    uVar15 = 0;
    iVar9 = 0;
    do {
      uVar17 = *(uint *)((long)cx + uVar15 * 4 + (long)cx[1]);
      if (((uVar17 & 0xffffff) != 0) &&
         ((sisoState < '\0' || ((sisoState == '\0') != (iVar8 + iVar16 != 1))))) {
        iVar9 = iVar8 + iVar16;
        local_48 = uVar17 & 0xffffff;
      }
      if (iVar16 < preLength) {
        pcVar11 = pre;
        iVar3 = iVar16 + 1;
        iVar4 = iVar8;
        iVar6 = iVar16;
      }
      else {
        if (srcLength <= iVar8) {
          if ((local_49 == '\0') && (iVar8 + iVar16 < 0x20)) {
            return -(iVar8 + iVar16);
          }
          goto LAB_003269df;
        }
        pcVar11 = src;
        iVar3 = iVar16;
        iVar4 = iVar8 + 1;
        iVar6 = iVar8;
      }
      iVar8 = iVar4;
      iVar16 = iVar3;
      lVar2 = uVar15 * 4 + (long)cx[1];
      puVar10 = (uint *)((long)cx + lVar2 + 4);
      bVar1 = pcVar11[iVar6];
      uVar7 = *puVar10 >> 0x18;
      uVar15 = 0;
      if (uVar7 <= bVar1) {
        uVar12 = uVar17 >> 0x18;
        uVar14 = (ulong)uVar12;
        uVar13 = (uint)*(byte *)((long)cx + uVar14 * 4 + lVar2 + 3);
        if (bVar1 <= uVar13) {
          if ((uVar13 - uVar7) + 1 == uVar12) {
            uVar15 = (ulong)(puVar10[(ulong)bVar1 - (ulong)uVar7] & 0xffffff);
          }
          else {
            uVar15 = 0;
            if (uVar17 < 0x2000000) {
              uVar13 = 0;
            }
            else {
              uVar7 = (uint)bVar1 * 0x1000000;
              uVar17 = 0;
              do {
                if ((uint)uVar14 < 5) {
                  uVar13 = uVar17;
                  if (((puVar10[(int)uVar17] < uVar7) &&
                      ((uVar13 = uVar17 + 1, (int)uVar12 <= (int)uVar13 ||
                       (puVar10[(int)uVar13] < uVar7)))) &&
                     ((uVar13 = uVar17 + 2, (int)uVar12 <= (int)uVar13 ||
                      (puVar10[(int)uVar13] < uVar7)))) {
                    uVar13 = uVar17 + 3;
                  }
                  break;
                }
                uVar13 = (int)(uVar17 + uVar12) / 2;
                if (puVar10[(int)uVar13] <= uVar7 + 0xffffff) {
                  uVar17 = uVar13;
                  uVar13 = uVar12;
                }
                uVar12 = uVar13;
                uVar14 = (ulong)(uVar12 - uVar17);
                uVar13 = uVar17;
              } while (1 < (int)(uVar12 - uVar17));
            }
            if (((int)uVar13 < (int)uVar12) &&
               (uVar15 = (ulong)(puVar10[(int)uVar13] & 0xffffff),
               puVar10[(int)uVar13] >> 0x18 != (uint)bVar1)) {
              uVar15 = 0;
            }
          }
        }
      }
      uVar17 = (uint)uVar15;
      if (uVar17 == 0) goto LAB_003269df;
    } while (uVar17 < 0x1f0000);
    if ((sisoState < '\0') || ((sisoState == '\0') != (iVar8 + iVar16 != 1))) {
      iVar9 = iVar8 + iVar16;
      local_48 = uVar17;
    }
LAB_003269df:
    if (iVar9 == 0) {
      iVar9 = 0;
    }
    else {
      *pMatchValue = local_48 & 0xff7fffff;
    }
  }
  return iVar9;
}

Assistant:

static int32_t
ucnv_extMatchToU(const int32_t *cx, int8_t sisoState,
                 const char *pre, int32_t preLength,
                 const char *src, int32_t srcLength,
                 uint32_t *pMatchValue,
                 UBool /*useFallback*/, UBool flush) {
    const uint32_t *toUTable, *toUSection;

    uint32_t value, matchValue;
    int32_t i, j, idx, length, matchLength;
    uint8_t b;

    if(cx==NULL || cx[UCNV_EXT_TO_U_LENGTH]<=0) {
        return 0; /* no extension data, no match */
    }

    /* initialize */
    toUTable=UCNV_EXT_ARRAY(cx, UCNV_EXT_TO_U_INDEX, uint32_t);
    idx=0;

    matchValue=0;
    i=j=matchLength=0;

    if(sisoState==0) {
        /* SBCS state of an SI/SO stateful converter, look at only exactly 1 byte */
        if(preLength>1) {
            return 0; /* no match of a DBCS sequence in SBCS mode */
        } else if(preLength==1) {
            srcLength=0;
        } else /* preLength==0 */ {
            if(srcLength>1) {
                srcLength=1;
            }
        }
        flush=TRUE;
    }

    /* we must not remember fallback matches when not using fallbacks */

    /* match input units until there is a full match or the input is consumed */
    for(;;) {
        /* go to the next section */
        toUSection=toUTable+idx;

        /* read first pair of the section */
        value=*toUSection++;
        length=UCNV_EXT_TO_U_GET_BYTE(value);
        value=UCNV_EXT_TO_U_GET_VALUE(value);
        if( value!=0 &&
            (UCNV_EXT_TO_U_IS_ROUNDTRIP(value) ||
             TO_U_USE_FALLBACK(useFallback)) &&
            UCNV_EXT_TO_U_VERIFY_SISO_MATCH(sisoState, i+j)
        ) {
            /* remember longest match so far */
            matchValue=value;
            matchLength=i+j;
        }

        /* match pre[] then src[] */
        if(i<preLength) {
            b=(uint8_t)pre[i++];
        } else if(j<srcLength) {
            b=(uint8_t)src[j++];
        } else {
            /* all input consumed, partial match */
            if(flush || (length=(i+j))>UCNV_EXT_MAX_BYTES) {
                /*
                 * end of the entire input stream, stop with the longest match so far
                 * or: partial match must not be longer than UCNV_EXT_MAX_BYTES
                 * because it must fit into state buffers
                 */
                break;
            } else {
                /* continue with more input next time */
                return -length;
            }
        }

        /* search for the current UChar */
        value=ucnv_extFindToU(toUSection, length, b);
        if(value==0) {
            /* no match here, stop with the longest match so far */
            break;
        } else {
            if(UCNV_EXT_TO_U_IS_PARTIAL(value)) {
                /* partial match, continue */
                idx=(int32_t)UCNV_EXT_TO_U_GET_PARTIAL_INDEX(value);
            } else {
                if( (UCNV_EXT_TO_U_IS_ROUNDTRIP(value) ||
                     TO_U_USE_FALLBACK(useFallback)) &&
                    UCNV_EXT_TO_U_VERIFY_SISO_MATCH(sisoState, i+j)
                ) {
                    /* full match, stop with result */
                    matchValue=value;
                    matchLength=i+j;
                } else {
                    /* full match on fallback not taken, stop with the longest match so far */
                }
                break;
            }
        }
    }

    if(matchLength==0) {
        /* no match at all */
        return 0;
    }

    /* return result */
    *pMatchValue=UCNV_EXT_TO_U_MASK_ROUNDTRIP(matchValue);
    return matchLength;
}